

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int32 invert(float32 **ainv,float32 **a,int32 n)

{
  integer *n_00;
  int local_3c;
  int local_38;
  int32 i;
  int32 nrhs;
  int32 info;
  float32 **tmp_a;
  char uplo;
  float32 **ppfStack_20;
  int32 n_local;
  float32 **a_local;
  float32 **ainv_local;
  
  tmp_a._4_4_ = n;
  ppfStack_20 = a;
  a_local = ainv;
  _nrhs = (undefined8 *)
          __ckd_calloc_2d__((long)n,(long)n,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/matrix.c"
                            ,0xd3);
  memcpy((void *)*_nrhs,*ppfStack_20,(long)(tmp_a._4_4_ * tmp_a._4_4_) << 2);
  memset(*a_local,0,(long)tmp_a._4_4_ * 4 * (long)tmp_a._4_4_);
  for (local_3c = 0; local_3c < tmp_a._4_4_; local_3c = local_3c + 1) {
    a_local[local_3c][local_3c] = 1.0;
  }
  tmp_a._3_1_ = 0x4c;
  local_38 = tmp_a._4_4_;
  n_00 = (integer *)((long)&tmp_a + 4);
  sposv_((char *)((long)&tmp_a + 3),n_00,&local_38,(real *)*_nrhs,n_00,(real *)*a_local,n_00,&i);
  ckd_free_2d(_nrhs);
  if (i == 0) {
    ainv_local._4_4_ = i;
  }
  else {
    ainv_local._4_4_ = -1;
  }
  return ainv_local._4_4_;
}

Assistant:

int32
invert(float32 ** ainv, float32 ** a, int32 n)
{
    char uplo;
    float32 **tmp_a;
    int32 info, nrhs, i;

    /* a is assumed to be symmetric, so we don't need to switch the
     * ordering of the data.  But we do need to copy it since it is
     * overwritten by LAPACK. */
    tmp_a = (float32 **)ckd_calloc_2d(n, n, sizeof(float32));
    memcpy(tmp_a[0], a[0], n*n*sizeof(float32));

    /* Construct an identity matrix. */
    memset(ainv[0], 0, sizeof(float32) * n * n);
    for (i = 0; i < n; i++)
        ainv[i][i] = 1.0;

    uplo = 'L';
    nrhs = n;
    sposv_(&uplo, &n, &nrhs, tmp_a[0], &n, ainv[0], &n, &info);

    ckd_free_2d((void **)tmp_a);

    if (info != 0)
	return -1;
    else
	return info;
}